

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O1

int splittingStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  long *plVar1;
  bool bVar2;
  SplittingStepCoefficients pSVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char *msgfmt;
  uint order;
  
  plVar1 = (long *)ark_mem->step_mem;
  if (plVar1 == (long *)0x0) {
    iVar6 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"splittingStep_Init",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    if ((ark_mem->interp_type == 0) && (0 < (long)(int)plVar1[3])) {
      lVar4 = 0;
      do {
        if (*(long *)(*(long *)(*(long *)(*plVar1 + lVar4 * 8) + 8) + 0x10) == 0) {
          msgfmt = "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation"
          ;
          iVar5 = 0x82;
          goto LAB_0015fc7a;
        }
        lVar4 = lVar4 + 1;
      } while ((int)plVar1[3] != lVar4);
    }
    iVar6 = 0;
    if (1 < init_type - 1U) {
      if (ark_mem->fixedstep == 0) {
        msgfmt = "Adaptive outer time stepping is not currently supported";
        iVar5 = 0x93;
LAB_0015fc7a:
        iVar6 = -0x16;
        arkProcessError(ark_mem,-0x16,iVar5,"splittingStep_Init",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                        ,msgfmt);
      }
      else {
        bVar2 = true;
        iVar6 = 0;
        if (plVar1[1] == 0) {
          order = *(uint *)((long)plVar1 + 0x1c);
          if ((int)order < 2) {
            pSVar3 = SplittingStepCoefficients_LieTrotter((int)plVar1[3]);
          }
          else if (order == 3) {
            pSVar3 = SplittingStepCoefficients_ThirdOrderSuzuki((int)plVar1[3]);
          }
          else {
            if ((order & 1) != 0) {
              order = order + 1;
              arkProcessError(ark_mem,99,0x5a,"splittingStep_SetCoefficients",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                              ,"No splitting method at requested order, using q=%i.",order);
            }
            pSVar3 = SplittingStepCoefficients_TripleJump((int)plVar1[3],order);
          }
          plVar1[1] = (long)pSVar3;
          iVar6 = 0;
          if (pSVar3 == (SplittingStepCoefficients)0x0) {
            bVar2 = false;
            iVar6 = -0x14;
            arkProcessError(ark_mem,-0x14,99,"splittingStep_SetCoefficients",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                            ,"Failed to allocate splitting coefficients");
          }
        }
        if (bVar2) {
          iVar6 = *(int *)(plVar1[1] + 0x1c) + -1;
          if (ark_mem->interp_degree < *(int *)(plVar1[1] + 0x1c)) {
            iVar6 = ark_mem->interp_degree;
          }
          iVar5 = 1;
          if (1 < iVar6) {
            iVar5 = iVar6;
          }
          ark_mem->interp_degree = iVar5;
          iVar6 = 0;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int splittingStep_Init(ARKodeMem ark_mem,
                              SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                              int init_type)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (ark_mem->interp_type == ARK_INTERP_HERMITE)
  {
    for (int i = 0; i < step_mem->partitions; i++)
    {
      if (step_mem->steppers[i]->ops->fullrhs == NULL)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation",
                        i);
        return ARK_ILL_INPUT;
      }
    }
  }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return ARK_SUCCESS;
  }

  /* assume fixed step size */
  if (!ark_mem->fixedstep)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Adaptive outer time stepping is not currently supported");
    return ARK_ILL_INPUT;
  }

  retval = splittingStep_SetCoefficients(ark_mem, step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  ark_mem->interp_degree =
    SUNMAX(1, SUNMIN(step_mem->coefficients->order - 1, ark_mem->interp_degree));

  return ARK_SUCCESS;
}